

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall
mkvmuxer::Colour::SetMasteringMetadata(Colour *this,MasteringMetadata *mastering_metadata)

{
  MasteringMetadata *this_00;
  bool bVar1;
  tuple<mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_> this_01;
  pointer __p;
  unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_> mm_ptr;
  
  this_01.
  super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
  .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
        )operator_new(0x28,(nothrow_t *)&std::nothrow);
  if (this_01.
      super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
      .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl ==
      (_Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>)0x0) {
    mm_ptr._M_t.
    super___uniq_ptr_impl<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
    ._M_t.
    super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
    .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl =
         (__uniq_ptr_data<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>,_true,_true>
          )(__uniq_ptr_impl<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
            )0x0;
  }
  else {
    *(PrimaryChromaticity **)
     ((long)this_01.
            super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
            .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl + 0x18) =
         (PrimaryChromaticity *)0x0;
    *(PrimaryChromaticity **)
     ((long)this_01.
            super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
            .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl + 0x20) =
         (PrimaryChromaticity *)0x0;
    *(PrimaryChromaticity **)
     ((long)this_01.
            super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
            .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl + 8) =
         (PrimaryChromaticity *)0x0;
    *(PrimaryChromaticity **)
     ((long)this_01.
            super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
            .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl + 0x10) =
         (PrimaryChromaticity *)0x0;
    *(undefined8 *)
     this_01.
     super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
     .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl =
         *(undefined8 *)mastering_metadata;
    mm_ptr._M_t.
    super___uniq_ptr_impl<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
    ._M_t.
    super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
    .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl =
         (__uniq_ptr_data<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>,_true,_true>
          )(__uniq_ptr_data<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>,_true,_true>
            )this_01.
             super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
             .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl;
    bVar1 = MasteringMetadata::SetChromaticity
                      ((MasteringMetadata *)
                       this_01.
                       super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
                       .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl,
                       mastering_metadata->r_,mastering_metadata->g_,mastering_metadata->b_,
                       mastering_metadata->white_point_);
    if (bVar1) {
      this_00 = this->mastering_metadata_;
      if (this_00 != (MasteringMetadata *)0x0) {
        MasteringMetadata::~MasteringMetadata(this_00);
      }
      operator_delete(this_00);
      mm_ptr._M_t.
      super___uniq_ptr_impl<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
      ._M_t.
      super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
      .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl =
           (__uniq_ptr_data<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>,_true,_true>
            )(__uniq_ptr_impl<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>
              )0x0;
      this->mastering_metadata_ =
           (MasteringMetadata *)
           this_01.
           super__Tuple_impl<0UL,_mkvmuxer::MasteringMetadata_*,_std::default_delete<mkvmuxer::MasteringMetadata>_>
           .super__Head_base<0UL,_mkvmuxer::MasteringMetadata_*,_false>._M_head_impl;
      bVar1 = true;
      goto LAB_0011c738;
    }
  }
  bVar1 = false;
LAB_0011c738:
  std::unique_ptr<mkvmuxer::MasteringMetadata,_std::default_delete<mkvmuxer::MasteringMetadata>_>::
  ~unique_ptr(&mm_ptr);
  return bVar1;
}

Assistant:

bool Colour::SetMasteringMetadata(const MasteringMetadata& mastering_metadata) {
  std::unique_ptr<MasteringMetadata> mm_ptr(new (std::nothrow)
                                                MasteringMetadata());
  if (!mm_ptr)
    return false;

  mm_ptr->set_luminance_max(mastering_metadata.luminance_max());
  mm_ptr->set_luminance_min(mastering_metadata.luminance_min());

  if (!mm_ptr->SetChromaticity(mastering_metadata.r(), mastering_metadata.g(),
                               mastering_metadata.b(),
                               mastering_metadata.white_point())) {
    return false;
  }

  delete mastering_metadata_;
  mastering_metadata_ = mm_ptr.release();
  return true;
}